

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Contacts.cc
# Opt level: O2

void RigidBodyDynamics::ComputeContactImpulsesRangeSpaceSparse
               (Model *model,VectorNd *Q,VectorNd *QDotMinus,ConstraintSet *CS,VectorNd *QDotPlus)

{
  ConstraintSet *H;
  LinearSolver linear_solver;
  void *local_50 [2];
  ConstraintSet *local_40;
  VectorNd *local_38;
  
  UpdateKinematicsCustom(model,Q,(VectorNd *)0x0,(VectorNd *)0x0);
  H = CS + 0xa8;
  CompositeRigidBodyAlgorithm(model,Q,(MatrixNd *)H,false);
  CalcContactJacobian(model,Q,CS,(MatrixNd *)(CS + 0xe0),false);
  linear_solver = 0x1140b6;
  local_40 = H;
  local_38 = QDotMinus;
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
  PlainObjectBase<Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,1,0,_1,1>,0>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)local_50,
             (DenseBase<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>
              *)&local_40);
  SolveContactSystemRangeSpaceSparse
            (model,(MatrixNd *)H,(MatrixNd *)(CS + 0xe0),(VectorNd *)local_50,
             (VectorNd *)(CS + 0x98),QDotPlus,(VectorNd *)(CS + 0x88),(MatrixNd *)(CS + 0x1d8),
             (VectorNd *)(CS + 0x1f0),linear_solver);
  free(local_50[0]);
  return;
}

Assistant:

RBDL_DLLAPI
void ComputeContactImpulsesRangeSpaceSparse (
		Model &model,
		const Math::VectorNd &Q,
		const Math::VectorNd &QDotMinus,
		ConstraintSet &CS,
		Math::VectorNd &QDotPlus
		) {
	// Compute H
	UpdateKinematicsCustom (model, &Q, NULL, NULL);
	CompositeRigidBodyAlgorithm (model, Q, CS.H, false);

	// Compute G
	CalcContactJacobian (model, Q, CS, CS.G, false);

	SolveContactSystemRangeSpaceSparse (model, CS.H, CS.G, CS.H * QDotMinus, CS.v_plus, QDotPlus, CS.impulse, CS.K, CS.a, CS.linear_solver);
}